

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int WebRtcIsac_EncodeLb(TransformTables *transform_tables,float *in,ISACLBEncStruct *ISACencLB_obj,
                       int16_t codingMode,int16_t bottleneckIndex)

{
  short sVar1;
  int16_t AvgPitchGain_Q12_00;
  int iVar2;
  int iVar3;
  double dVar4;
  double local_3df0;
  double transcodeScale;
  double bytesSpecCoderUsed;
  int intVar;
  uint16_t payloadLimitBytes;
  double bytesLeftSpecCoding;
  transcode_obj transcodingParam;
  int my_index;
  int status;
  int frame_mode;
  short local_3d4c;
  int16_t AvgPitchGain_Q12;
  int16_t PitchGains_Q12 [4];
  double PitchGains [4];
  double PitchLags [4];
  int16_t fim [240];
  int16_t fre [240];
  double LPw_pf [240];
  double HPw [240];
  double LPw [240];
  double LP_lookahead_pf [264];
  double HP_lookahead [240];
  double LP_lookahead [240];
  float HP [240];
  float LP [240];
  double hifilt_coef [42];
  double lofilt_coef [78];
  int local_3c;
  int local_38;
  int iterCntr;
  int k;
  int err;
  int stream_length;
  int16_t bottleneckIndex_local;
  int16_t codingMode_local;
  ISACLBEncStruct *ISACencLB_obj_local;
  float *in_local;
  TransformTables *transform_tables_local;
  
  transcodingParam.stream[0] = '\0';
  transcodingParam.stream[1] = '\0';
  transcodingParam.stream[2] = '\0';
  transcodingParam._111_1_ = 0;
  if (ISACencLB_obj->buffer_index == 0) {
    ISACencLB_obj->current_framesamples = ISACencLB_obj->new_framelength;
  }
  iVar2 = (int)ISACencLB_obj->current_framesamples / 0x3c0;
  for (local_38 = 0; local_38 < 0xa0; local_38 = local_38 + 1) {
    ISACencLB_obj->data_buffer_float[local_38 + ISACencLB_obj->buffer_index] = in[local_38];
  }
  if (ISACencLB_obj->buffer_index == 0x140) {
    ISACencLB_obj->buffer_index = 0;
    if ((iVar2 == 0) || (ISACencLB_obj->frame_nb == 0)) {
      WebRtcIsac_ResetBitstream(&ISACencLB_obj->bitstr_obj);
      if ((codingMode == 0) && ((iVar2 == 0 && (ISACencLB_obj->enforceFrameSize == 0)))) {
        iVar3 = WebRtcIsac_GetNewFrameLength
                          (ISACencLB_obj->bottleneck,(int)ISACencLB_obj->current_framesamples);
        ISACencLB_obj->new_framelength = (int16_t)iVar3;
      }
      dVar4 = WebRtcIsac_GetSnr(ISACencLB_obj->bottleneck,(int)ISACencLB_obj->current_framesamples);
      ISACencLB_obj->s2nr = dVar4;
      transcodingParam._108_4_ =
           WebRtcIsac_EncodeFrameLen(ISACencLB_obj->current_framesamples,&ISACencLB_obj->bitstr_obj)
      ;
      if ((int)transcodingParam._108_4_ < 0) {
        return transcodingParam._108_4_;
      }
      (ISACencLB_obj->SaveEnc_obj).framelength = ISACencLB_obj->current_framesamples;
      ISACencLB_obj->lastBWIdx = bottleneckIndex;
      bytesSpecCoderUsed._0_4_ = (int)bottleneckIndex;
      WebRtcIsac_EncodeReceiveBw((int *)&bytesSpecCoderUsed,&ISACencLB_obj->bitstr_obj);
    }
    WebRtcIsac_SplitAndFilterFloat
              (ISACencLB_obj->data_buffer_float,HP + 0xee,(float *)(LP_lookahead + 0xef),
               HP_lookahead + 0xef,LP_lookahead_pf + 0x107,&ISACencLB_obj->prefiltbankstr_obj);
    WebRtcIsac_PitchAnalysis
              (HP_lookahead + 0xef,LPw + 0xef,&ISACencLB_obj->pitchanalysisstr_obj,PitchGains + 3,
               (double *)PitchGains_Q12);
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      *(short *)((long)&frame_mode + (long)local_38 * 2) =
           (short)(int)(PitchGains[(long)local_38 + -1] * 4096.0);
    }
    if ((iVar2 == 0) || (ISACencLB_obj->frame_nb == 0)) {
      (ISACencLB_obj->SaveEnc_obj).startIdx = 0;
    }
    else {
      (ISACencLB_obj->SaveEnc_obj).startIdx = 1;
    }
    WebRtcIsac_EncodePitchGain
              ((int16_t *)&frame_mode,&ISACencLB_obj->bitstr_obj,&ISACencLB_obj->SaveEnc_obj);
    WebRtcIsac_EncodePitchLag
              (PitchGains + 3,(int16_t *)&frame_mode,&ISACencLB_obj->bitstr_obj,
               &ISACencLB_obj->SaveEnc_obj);
    AvgPitchGain_Q12_00 =
         (int16_t)((int)(short)frame_mode + (int)frame_mode._2_2_ + (int)local_3d4c +
                   (int)AvgPitchGain_Q12 >> 2);
    WebRtcIsac_GetLpcCoefLb
              (LPw + 0xef,LP_lookahead_pf + 0x107,&ISACencLB_obj->maskfiltstr_obj,
               ISACencLB_obj->s2nr,(int16_t *)&frame_mode,hifilt_coef + 0x29,(double *)(LP + 0xee));
    WebRtcIsac_EncodeLpcLb
              (hifilt_coef + 0x29,(double *)(LP + 0xee),&ISACencLB_obj->bitstr_obj,
               &ISACencLB_obj->SaveEnc_obj);
    for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
      PitchGains[(long)local_38 + -1] =
           (double)((float)(int)*(short *)((long)&frame_mode + (long)local_38 * 2) / 4096.0);
    }
    transcodingParam.hiFiltGain[5]._0_4_ = (ISACencLB_obj->bitstr_obj).W_upper;
    transcodingParam.W_upper = (ISACencLB_obj->bitstr_obj).stream_index;
    transcodingParam.hiFiltGain[5]._4_4_ = (ISACencLB_obj->bitstr_obj).streamval;
    transcodingParam.streamval._0_1_ =
         (ISACencLB_obj->bitstr_obj).stream[(ISACencLB_obj->bitstr_obj).stream_index - 2];
    transcodingParam.streamval._1_1_ =
         (ISACencLB_obj->bitstr_obj).stream[(ISACencLB_obj->bitstr_obj).stream_index - 1];
    transcodingParam.streamval._2_1_ =
         (ISACencLB_obj->bitstr_obj).stream[(ISACencLB_obj->bitstr_obj).stream_index];
    for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
      transcodingParam.loFiltGain[(long)local_38 + -1] = hifilt_coef[(long)(local_38 * 0xd) + 0x29];
      transcodingParam.loFiltGain[(long)local_38 + 5] = hifilt_coef[(long)(local_38 * 7) + -1];
    }
    WebRtcIsac_EncodeLpcGainLb
              (hifilt_coef + 0x29,(double *)(LP + 0xee),&ISACencLB_obj->bitstr_obj,
               &ISACencLB_obj->SaveEnc_obj);
    if ((iVar2 == 1) && (ISACencLB_obj->frame_nb == 0)) {
      bytesSpecCoderUsed._6_2_ = ISACencLB_obj->payloadLimitBytes60 >> 1;
    }
    else {
      if (iVar2 == 0) {
        sVar1 = ISACencLB_obj->payloadLimitBytes30;
      }
      else {
        sVar1 = ISACencLB_obj->payloadLimitBytes60;
      }
      bytesSpecCoderUsed._6_2_ = sVar1 - 3;
    }
    _intVar = (double)(bytesSpecCoderUsed._6_2_ - transcodingParam.W_upper);
    WebRtcIsac_NormLatticeFilterMa
              (0xc,(ISACencLB_obj->maskfiltstr_obj).PreStateLoF,
               (ISACencLB_obj->maskfiltstr_obj).PreStateLoG,HP + 0xee,hifilt_coef + 0x29,HPw + 0xef)
    ;
    WebRtcIsac_NormLatticeFilterMa
              (6,(ISACencLB_obj->maskfiltstr_obj).PreStateHiF,
               (ISACencLB_obj->maskfiltstr_obj).PreStateHiG,(float *)(LP_lookahead + 0xef),
               (double *)(LP + 0xee),LPw_pf + 0xef);
    WebRtcIsac_PitchfilterPre
              (HPw + 0xef,(double *)(fre + 0xec),&ISACencLB_obj->pitchfiltstr_obj,PitchGains + 3,
               (double *)PitchGains_Q12);
    WebRtcIsac_Time2Spec
              (transform_tables,(double *)(fre + 0xec),LPw_pf + 0xef,fim + 0xec,
               (int16_t *)(PitchLags + 3),&ISACencLB_obj->fftstr_obj);
    transcodingParam.stream_index = (ISACencLB_obj->SaveEnc_obj).startIdx * 0xf0;
    memcpy((ISACencLB_obj->SaveEnc_obj).fre + (int)transcodingParam.stream_index,fim + 0xec,0x1e0);
    memcpy((ISACencLB_obj->SaveEnc_obj).fim + (int)transcodingParam.stream_index,PitchLags + 3,0x1e0
          );
    (ISACencLB_obj->SaveEnc_obj).AvgPitchGain[(ISACencLB_obj->SaveEnc_obj).startIdx] =
         AvgPitchGain_Q12_00;
    iterCntr = WebRtcIsac_EncodeSpec
                         (fim + 0xec,(int16_t *)(PitchLags + 3),AvgPitchGain_Q12_00,kIsacLowerBand,
                          &ISACencLB_obj->bitstr_obj);
    if ((iterCntr < 0) && (iterCntr != -0x1928)) {
      transform_tables_local._4_4_ = iterCntr;
      if ((iVar2 == 1) && (ISACencLB_obj->frame_nb == 1)) {
        ISACencLB_obj->frame_nb = 0;
      }
    }
    else {
      local_3c = 0;
      while ((uint)bytesSpecCoderUsed._6_2_ < (ISACencLB_obj->bitstr_obj).stream_index ||
             iterCntr == -0x1928) {
        if (4 < local_3c) {
          if ((iVar2 == 1) && (ISACencLB_obj->frame_nb == 0)) {
            ISACencLB_obj->frame_nb = 1;
            return 0;
          }
          if ((iVar2 == 1) && (ISACencLB_obj->frame_nb == 1)) {
            ISACencLB_obj->frame_nb = 0;
          }
          if (iterCntr != -0x1928) {
            return -0x1932;
          }
          iVar2._0_1_ = transcodingParam.stream[0];
          iVar2._1_1_ = transcodingParam.stream[1];
          iVar2._2_1_ = transcodingParam.stream[2];
          iVar2._3_1_ = transcodingParam._111_1_;
          return iVar2;
        }
        if (iterCntr == -0x1928) {
          local_3df0 = (_intVar / 600.0) * 0.5;
        }
        else {
          local_3df0 = _intVar / (double)((ISACencLB_obj->bitstr_obj).stream_index -
                                         transcodingParam.W_upper);
        }
        local_3df0 = (1.0 - ((double)local_3c * 0.9) / 5.0) * local_3df0;
        for (local_38 = 0; local_38 < 6; local_38 = local_38 + 1) {
          hifilt_coef[(long)(local_38 * 0xd) + 0x29] =
               transcodingParam.loFiltGain[(long)local_38 + -1] * local_3df0;
          hifilt_coef[(long)(local_38 * 7) + -1] =
               transcodingParam.loFiltGain[(long)local_38 + 5] * local_3df0;
          transcodingParam.loFiltGain[(long)local_38 + -1] =
               hifilt_coef[(long)(local_38 * 0xd) + 0x29];
          transcodingParam.loFiltGain[(long)local_38 + 5] = hifilt_coef[(long)(local_38 * 7) + -1];
        }
        for (local_38 = 0; local_38 < 0xf0; local_38 = local_38 + 1) {
          fim[(long)local_38 + 0xec] =
               (int16_t)(int)((double)(int)fim[(long)local_38 + 0xec] * local_3df0);
          fim[(long)local_38 + -4] =
               (int16_t)(int)((double)(int)fim[(long)local_38 + -4] * local_3df0);
        }
        transcodingParam.stream_index = (ISACencLB_obj->SaveEnc_obj).startIdx * 0xf0;
        memcpy((ISACencLB_obj->SaveEnc_obj).fre + (int)transcodingParam.stream_index,fim + 0xec,
               0x1e0);
        memcpy((ISACencLB_obj->SaveEnc_obj).fim + (int)transcodingParam.stream_index,PitchLags + 3,
               0x1e0);
        (ISACencLB_obj->bitstr_obj).W_upper = transcodingParam.hiFiltGain[5]._0_4_;
        (ISACencLB_obj->bitstr_obj).stream_index = transcodingParam.W_upper;
        (ISACencLB_obj->bitstr_obj).streamval = transcodingParam.hiFiltGain[5]._4_4_;
        (ISACencLB_obj->bitstr_obj).stream[transcodingParam.W_upper - 2] =
             (uint8_t)transcodingParam.streamval;
        (ISACencLB_obj->bitstr_obj).stream[transcodingParam.W_upper - 1] =
             transcodingParam.streamval._1_1_;
        (ISACencLB_obj->bitstr_obj).stream[transcodingParam.W_upper] =
             transcodingParam.streamval._2_1_;
        WebRtcIsac_EncodeLpcGainLb
                  (hifilt_coef + 0x29,(double *)(LP + 0xee),&ISACencLB_obj->bitstr_obj,
                   &ISACencLB_obj->SaveEnc_obj);
        _intVar = (double)(bytesSpecCoderUsed._6_2_ - transcodingParam.W_upper);
        iterCntr = WebRtcIsac_EncodeSpec
                             (fim + 0xec,(int16_t *)(PitchLags + 3),AvgPitchGain_Q12_00,
                              kIsacLowerBand,&ISACencLB_obj->bitstr_obj);
        if ((iterCntr < 0) && (iterCntr != -0x1928)) {
          if (iVar2 != 1) {
            return iterCntr;
          }
          if (ISACencLB_obj->frame_nb != 1) {
            return iterCntr;
          }
          ISACencLB_obj->frame_nb = 0;
          return iterCntr;
        }
        local_3c = local_3c + 1;
      }
      if (iVar2 == 1) {
        if (ISACencLB_obj->frame_nb == 0) {
          ISACencLB_obj->frame_nb = 1;
          return 0;
        }
        if (((ISACencLB_obj->frame_nb == 1) && (ISACencLB_obj->frame_nb = 0, codingMode == 0)) &&
           (ISACencLB_obj->enforceFrameSize == 0)) {
          iVar2 = WebRtcIsac_GetNewFrameLength
                            (ISACencLB_obj->bottleneck,(int)ISACencLB_obj->current_framesamples);
          ISACencLB_obj->new_framelength = (int16_t)iVar2;
        }
      }
      else {
        ISACencLB_obj->frame_nb = 0;
      }
      transform_tables_local._4_4_ = WebRtcIsac_EncTerminate(&ISACencLB_obj->bitstr_obj);
    }
  }
  else {
    ISACencLB_obj->buffer_index = ISACencLB_obj->buffer_index + 0xa0;
    transform_tables_local._4_4_ = 0;
  }
  return transform_tables_local._4_4_;
}

Assistant:

int WebRtcIsac_EncodeLb(const TransformTables* transform_tables,
                        float* in, ISACLBEncStruct* ISACencLB_obj,
                        int16_t codingMode,
                        int16_t bottleneckIndex) {
  int stream_length = 0;
  int err;
  int k;
  int iterCntr;

  double lofilt_coef[(ORDERLO + 1)*SUBFRAMES];
  double hifilt_coef[(ORDERHI + 1)*SUBFRAMES];
  float LP[FRAMESAMPLES_HALF];
  float HP[FRAMESAMPLES_HALF];

  double LP_lookahead[FRAMESAMPLES_HALF];
  double HP_lookahead[FRAMESAMPLES_HALF];
  double LP_lookahead_pf[FRAMESAMPLES_HALF + QLOOKAHEAD];
  double LPw[FRAMESAMPLES_HALF];

  double HPw[FRAMESAMPLES_HALF];
  double LPw_pf[FRAMESAMPLES_HALF];
  int16_t fre[FRAMESAMPLES_HALF];   /* Q7 */
  int16_t fim[FRAMESAMPLES_HALF];   /* Q7 */

  double PitchLags[4];
  double PitchGains[4];
  int16_t PitchGains_Q12[4];
  int16_t AvgPitchGain_Q12;

  int frame_mode; /* 0 for 30ms, 1 for 60ms */
  int status = 0;
  int my_index;
  transcode_obj transcodingParam;
  double bytesLeftSpecCoding;
  uint16_t payloadLimitBytes;

  /* Copy new frame-length and bottleneck rate only for the first 10 ms data */
  if (ISACencLB_obj->buffer_index == 0) {
    /* Set the framelength for the next packet. */
    ISACencLB_obj->current_framesamples = ISACencLB_obj->new_framelength;
  }
  /* 'frame_mode' is 0 (30 ms) or 1 (60 ms). */
  frame_mode = ISACencLB_obj->current_framesamples / MAX_FRAMESAMPLES;

  /* buffer speech samples (by 10ms packet) until the frame-length */
  /* is reached (30 or 60 ms).                                     */
  /*****************************************************************/

  /* fill the buffer with 10ms input data */
  for (k = 0; k < FRAMESAMPLES_10ms; k++) {
    ISACencLB_obj->data_buffer_float[k + ISACencLB_obj->buffer_index] = in[k];
  }

  /* If buffersize is not equal to current framesize then increase index
   * and return. We do no encoding untill we have enough audio.  */
  if (ISACencLB_obj->buffer_index + FRAMESAMPLES_10ms != FRAMESAMPLES) {
    ISACencLB_obj->buffer_index += FRAMESAMPLES_10ms;
    return 0;
  }
  /* If buffer reached the right size, reset index and continue with
   * encoding the frame. */
  ISACencLB_obj->buffer_index = 0;

  /* End of buffer function. */
  /**************************/

  /* Encoding */
  /************/

  if (frame_mode == 0 || ISACencLB_obj->frame_nb == 0) {
    /* This is to avoid Linux warnings until we change 'int' to 'Word32'
     * at all places. */
    int intVar;
    /* reset bitstream */
    WebRtcIsac_ResetBitstream(&(ISACencLB_obj->bitstr_obj));

    if ((codingMode == 0) && (frame_mode == 0) &&
        (ISACencLB_obj->enforceFrameSize == 0)) {
      ISACencLB_obj->new_framelength = WebRtcIsac_GetNewFrameLength(
          ISACencLB_obj->bottleneck, ISACencLB_obj->current_framesamples);
    }

    ISACencLB_obj->s2nr = WebRtcIsac_GetSnr(
        ISACencLB_obj->bottleneck, ISACencLB_obj->current_framesamples);

    /* Encode frame length. */
    status = WebRtcIsac_EncodeFrameLen(
        ISACencLB_obj->current_framesamples, &ISACencLB_obj->bitstr_obj);
    if (status < 0) {
      /* Wrong frame size. */
      return status;
    }
    /* Save framelength for multiple packets memory. */
    ISACencLB_obj->SaveEnc_obj.framelength =
        ISACencLB_obj->current_framesamples;

    /* To be used for Redundant Coding. */
    ISACencLB_obj->lastBWIdx = bottleneckIndex;
    intVar = (int)bottleneckIndex;
    WebRtcIsac_EncodeReceiveBw(&intVar, &ISACencLB_obj->bitstr_obj);
  }

  /* Split signal in two bands. */
  WebRtcIsac_SplitAndFilterFloat(ISACencLB_obj->data_buffer_float, LP, HP,
                                 LP_lookahead, HP_lookahead,
                                 &ISACencLB_obj->prefiltbankstr_obj);

  /* estimate pitch parameters and pitch-filter lookahead signal */
  WebRtcIsac_PitchAnalysis(LP_lookahead, LP_lookahead_pf,
                           &ISACencLB_obj->pitchanalysisstr_obj, PitchLags,
                           PitchGains);

  /* Encode in FIX Q12. */

  /* Convert PitchGain to Fixed point. */
  for (k = 0; k < PITCH_SUBFRAMES; k++) {
    PitchGains_Q12[k] = (int16_t)(PitchGains[k] * 4096.0);
  }

  /* Set where to store data in multiple packets memory. */
  if (frame_mode == 0 || ISACencLB_obj->frame_nb == 0) {
    ISACencLB_obj->SaveEnc_obj.startIdx = 0;
  } else {
    ISACencLB_obj->SaveEnc_obj.startIdx = 1;
  }

  /* Quantize & encode pitch parameters. */
  WebRtcIsac_EncodePitchGain(PitchGains_Q12, &ISACencLB_obj->bitstr_obj,
                             &ISACencLB_obj->SaveEnc_obj);
  WebRtcIsac_EncodePitchLag(PitchLags, PitchGains_Q12,
                            &ISACencLB_obj->bitstr_obj,
                            &ISACencLB_obj->SaveEnc_obj);

  AvgPitchGain_Q12 = (PitchGains_Q12[0] + PitchGains_Q12[1] +
      PitchGains_Q12[2] + PitchGains_Q12[3]) >> 2;

  /* Find coefficients for perceptual pre-filters. */
  WebRtcIsac_GetLpcCoefLb(LP_lookahead_pf, HP_lookahead,
                          &ISACencLB_obj->maskfiltstr_obj, ISACencLB_obj->s2nr,
                          PitchGains_Q12, lofilt_coef, hifilt_coef);

  /* Code LPC model and shape - gains not quantized yet. */
  WebRtcIsac_EncodeLpcLb(lofilt_coef, hifilt_coef, &ISACencLB_obj->bitstr_obj,
                         &ISACencLB_obj->SaveEnc_obj);

  /* Convert PitchGains back to FLOAT for pitchfilter_pre. */
  for (k = 0; k < 4; k++) {
    PitchGains[k] = ((float)PitchGains_Q12[k]) / 4096;
  }

  /* Store the state of arithmetic coder before coding LPC gains. */
  transcodingParam.W_upper = ISACencLB_obj->bitstr_obj.W_upper;
  transcodingParam.stream_index = ISACencLB_obj->bitstr_obj.stream_index;
  transcodingParam.streamval = ISACencLB_obj->bitstr_obj.streamval;
  transcodingParam.stream[0] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index -
                                       2];
  transcodingParam.stream[1] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index -
                                       1];
  transcodingParam.stream[2] =
      ISACencLB_obj->bitstr_obj.stream[ISACencLB_obj->bitstr_obj.stream_index];

  /* Store LPC Gains before encoding them. */
  for (k = 0; k < SUBFRAMES; k++) {
    transcodingParam.loFiltGain[k] = lofilt_coef[(LPC_LOBAND_ORDER + 1) * k];
    transcodingParam.hiFiltGain[k] = hifilt_coef[(LPC_HIBAND_ORDER + 1) * k];
  }

  /* Code gains */
  WebRtcIsac_EncodeLpcGainLb(lofilt_coef, hifilt_coef,
                             &ISACencLB_obj->bitstr_obj,
                             &ISACencLB_obj->SaveEnc_obj);

  /* Get the correct value for the payload limit and calculate the
   * number of bytes left for coding the spectrum. */
  if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 0)) {
    /* It is a 60ms and we are in the first 30ms then the limit at
     * this point should be half of the assigned value. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes60 >> 1;
  } else if (frame_mode == 0) {
    /* It is a 30ms frame */
    /* Subract 3 because termination process may add 3 bytes. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes30 - 3;
  } else {
    /* This is the second half of a 60ms frame. */
    /* Subract 3 because termination process may add 3 bytes. */
    payloadLimitBytes = ISACencLB_obj->payloadLimitBytes60 - 3;
  }
  bytesLeftSpecCoding = payloadLimitBytes - transcodingParam.stream_index;

  /* Perceptual pre-filtering (using normalized lattice filter). */
  /* Low-band filtering. */
  WebRtcIsac_NormLatticeFilterMa(ORDERLO,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateLoF,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateLoG,
                                 LP, lofilt_coef, LPw);
  /* High-band filtering. */
  WebRtcIsac_NormLatticeFilterMa(ORDERHI,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateHiF,
                                 ISACencLB_obj->maskfiltstr_obj.PreStateHiG,
                                 HP, hifilt_coef, HPw);
  /* Pitch filter. */
  WebRtcIsac_PitchfilterPre(LPw, LPw_pf, &ISACencLB_obj->pitchfiltstr_obj,
                            PitchLags, PitchGains);
  /* Transform */
  WebRtcIsac_Time2Spec(transform_tables,
                       LPw_pf, HPw, fre, fim, &ISACencLB_obj->fftstr_obj);

  /* Save data for multiple packets memory. */
  my_index = ISACencLB_obj->SaveEnc_obj.startIdx * FRAMESAMPLES_HALF;
  memcpy(&ISACencLB_obj->SaveEnc_obj.fre[my_index], fre, sizeof(fre));
  memcpy(&ISACencLB_obj->SaveEnc_obj.fim[my_index], fim, sizeof(fim));

  ISACencLB_obj->SaveEnc_obj.AvgPitchGain[ISACencLB_obj->SaveEnc_obj.startIdx] =
      AvgPitchGain_Q12;

  /* Quantization and loss-less coding. */
  err = WebRtcIsac_EncodeSpec(fre, fim, AvgPitchGain_Q12, kIsacLowerBand,
                              &ISACencLB_obj->bitstr_obj);
  if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    /* There has been an error but it was not too large payload
       (we can cure too large payload). */
    if (frame_mode == 1 && ISACencLB_obj->frame_nb == 1) {
      /* If this is the second 30ms of a 60ms frame reset
         this such that in the next call encoder starts fresh. */
      ISACencLB_obj->frame_nb = 0;
    }
    return err;
  }
  iterCntr = 0;
  while ((ISACencLB_obj->bitstr_obj.stream_index > payloadLimitBytes) ||
      (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
    double bytesSpecCoderUsed;
    double transcodeScale;

    if (iterCntr >= MAX_PAYLOAD_LIMIT_ITERATION) {
      /* We were not able to limit the payload size */
      if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 0)) {
        /* This was the first 30ms of a 60ms frame. Although
           the payload is larger than it should be but we let
           the second 30ms be encoded. Maybe together we
           won't exceed the limit. */
        ISACencLB_obj->frame_nb = 1;
        return 0;
      } else if ((frame_mode == 1) && (ISACencLB_obj->frame_nb == 1)) {
        ISACencLB_obj->frame_nb = 0;
      }

      if (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
        return -ISAC_PAYLOAD_LARGER_THAN_LIMIT;
      } else {
        return status;
      }
    }

    if (err == -ISAC_DISALLOWED_BITSTREAM_LENGTH) {
      bytesSpecCoderUsed = STREAM_SIZE_MAX;
      /* Being conservative */
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed * 0.5;
    } else {
      bytesSpecCoderUsed = ISACencLB_obj->bitstr_obj.stream_index -
          transcodingParam.stream_index;
      transcodeScale = bytesLeftSpecCoding / bytesSpecCoderUsed;
    }

    /* To be safe, we reduce the scale depending on
       the number of iterations. */
    transcodeScale *= (1.0 - (0.9 * (double)iterCntr /
        (double)MAX_PAYLOAD_LIMIT_ITERATION));

    /* Scale the LPC Gains. */
    for (k = 0; k < SUBFRAMES; k++) {
      lofilt_coef[(LPC_LOBAND_ORDER + 1) * k] =
          transcodingParam.loFiltGain[k] * transcodeScale;
      hifilt_coef[(LPC_HIBAND_ORDER + 1) * k] =
          transcodingParam.hiFiltGain[k] * transcodeScale;
      transcodingParam.loFiltGain[k] = lofilt_coef[(LPC_LOBAND_ORDER + 1) * k];
      transcodingParam.hiFiltGain[k] = hifilt_coef[(LPC_HIBAND_ORDER + 1) * k];
    }

    /* Scale DFT coefficients. */
    for (k = 0; k < FRAMESAMPLES_HALF; k++) {
      fre[k] = (int16_t)(fre[k] * transcodeScale);
      fim[k] = (int16_t)(fim[k] * transcodeScale);
    }

    /* Save data for multiple packets memory. */
    my_index = ISACencLB_obj->SaveEnc_obj.startIdx * FRAMESAMPLES_HALF;
    memcpy(&ISACencLB_obj->SaveEnc_obj.fre[my_index], fre, sizeof(fre));
    memcpy(&ISACencLB_obj->SaveEnc_obj.fim[my_index], fim, sizeof(fim));

    /* Re-store the state of arithmetic coder before coding LPC gains. */
    ISACencLB_obj->bitstr_obj.W_upper = transcodingParam.W_upper;
    ISACencLB_obj->bitstr_obj.stream_index = transcodingParam.stream_index;
    ISACencLB_obj->bitstr_obj.streamval = transcodingParam.streamval;
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index - 2] =
        transcodingParam.stream[0];
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index - 1] =
        transcodingParam.stream[1];
    ISACencLB_obj->bitstr_obj.stream[transcodingParam.stream_index] =
        transcodingParam.stream[2];

    /* Code gains. */
    WebRtcIsac_EncodeLpcGainLb(lofilt_coef, hifilt_coef,
                               &ISACencLB_obj->bitstr_obj,
                               &ISACencLB_obj->SaveEnc_obj);

    /* Update the number of bytes left for encoding the spectrum. */
    bytesLeftSpecCoding = payloadLimitBytes - transcodingParam.stream_index;

    /* Encode the spectrum. */
    err = WebRtcIsac_EncodeSpec(fre, fim, AvgPitchGain_Q12, kIsacLowerBand,
                                &ISACencLB_obj->bitstr_obj);

    if ((err < 0) && (err != -ISAC_DISALLOWED_BITSTREAM_LENGTH)) {
      /* There has been an error but it was not too large
         payload (we can cure too large payload). */
      if (frame_mode == 1 && ISACencLB_obj->frame_nb == 1) {
        /* If this is the second 30 ms of a 60 ms frame reset
           this such that in the next call encoder starts fresh. */
        ISACencLB_obj->frame_nb = 0;
      }
      return err;
    }
    iterCntr++;
  }

  /* If 60 ms frame-size and just processed the first 30 ms, */
  /* go back to main function to buffer the other 30 ms speech frame. */
  if (frame_mode == 1) {
    if (ISACencLB_obj->frame_nb == 0) {
      ISACencLB_obj->frame_nb = 1;
      return 0;
    } else if (ISACencLB_obj->frame_nb == 1) {
      ISACencLB_obj->frame_nb = 0;
      /* Also update the frame-length for next packet,
         in Adaptive mode only. */
      if (codingMode == 0 && (ISACencLB_obj->enforceFrameSize == 0)) {
        ISACencLB_obj->new_framelength =
            WebRtcIsac_GetNewFrameLength(ISACencLB_obj->bottleneck,
                                         ISACencLB_obj->current_framesamples);
      }
    }
  } else {
    ISACencLB_obj->frame_nb = 0;
  }

  /* Complete arithmetic coding. */
  stream_length = WebRtcIsac_EncTerminate(&ISACencLB_obj->bitstr_obj);
  return stream_length;
}